

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O3

string * __thiscall
pbrt::ShapeSceneEntity::ToString_abi_cxx11_(string *__return_storage_ptr__,ShapeSceneEntity *this)

{
  Transform *args_3;
  Transform *args_2;
  
  args_3 = this->objectFromRender;
  args_2 = this->renderFromObject;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&,pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,int_const&,std::__cxx11::string_const&,int_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (__return_storage_ptr__,
             "[ ShapeSeneEntity name: %s parameters: %s loc: %s renderFromObject: %s objectFromRender: %s reverseOrientation: %s materialIndex: %d materialName: %s lightIndex: %d insideMedium: %s outsideMedium: %s]"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             &(this->super_SceneEntity).parameters,&(this->super_SceneEntity).loc,args_2,args_3,
             &this->reverseOrientation,&this->materialIndex,&this->materialName,&this->lightIndex,
             &this->insideMedium,&this->outsideMedium);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf(
            "[ ShapeSeneEntity name: %s parameters: %s loc: %s "
            "renderFromObject: %s objectFromRender: %s reverseOrientation: %s "
            "materialIndex: %d materialName: %s lightIndex: %d "
            "insideMedium: %s outsideMedium: %s]",
            name, parameters, loc, *renderFromObject, *objectFromRender,
            reverseOrientation, materialIndex, materialName, lightIndex, insideMedium,
            outsideMedium);
    }